

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

bool google::protobuf::io::Printer::Validate
               (bool cond,PrintOptions opts,
               FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               message)

{
  undefined7 in_register_00000039;
  LogMessage LStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000039,cond) == 0) {
    if ((opts._0_4_ >> 0x10 & 1) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                 ,0x141);
      (*message.invoker_)(&local_38,(VoidPtr)message.ptr_.obj);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_48);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&LStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
               ,0x13f);
    (*message.invoker_)(&local_38,(VoidPtr)message.ptr_.obj);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&LStack_48);
  }
  return cond;
}

Assistant:

bool Printer::Validate(bool cond, Printer::PrintOptions opts,
                       absl::FunctionRef<std::string()> message) {
  if (!cond) {
    if (opts.checks_are_debug_only) {
      ABSL_DLOG(FATAL) << message();
    } else {
      ABSL_LOG(FATAL) << message();
    }
  }
  return cond;
}